

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::resetHeuristic(Solver *this,Solver *s,DecisionHeuristic *h,Type t)

{
  DecisionHeuristic *pDVar1;
  Type in_ECX;
  DecisionHeuristic *in_RDX;
  long in_RSI;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *in_RDI;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *this_00;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> local_28;
  Type local_1c;
  DecisionHeuristic *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  if (in_RSI != 0) {
    pDVar1 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1e5c77);
    if (pDVar1 != (DecisionHeuristic *)0x0) {
      pDVar1 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1e5c8b)
      ;
      (*pDVar1->_vptr_DecisionHeuristic[4])(pDVar1,in_RDI);
    }
  }
  if (local_18 == (DecisionHeuristic *)0x0) {
    local_18 = (DecisionHeuristic *)&null_heuristic_g;
    local_1c = Retain;
  }
  this_00 = &local_28;
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::SingleOwnerPtr
            (this_00,local_18,local_1c);
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::swap(in_RDI,this_00);
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1e5cea);
  return;
}

Assistant:

void Solver::resetHeuristic(Solver* s, DecisionHeuristic* h, Ownership_t::Type t) {
	if (s && heuristic_.get()) { heuristic_->detach(*this); }
	if (!h) { h = &null_heuristic_g; t = Ownership_t::Retain; }
	HeuristicPtr(h, t).swap(heuristic_);
}